

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

void __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<-16>,_boost::random::detail::M3<-15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<-2>,_boost::random::detail::M3<-18>,_boost::random::detail::M2<-28>,_boost::random::detail::M5<-5,_3661901092U>,_boost::random::detail::no_tempering>
::seed(well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
       *this,uint *value)

{
  result_type rVar1;
  uint (*s) [16];
  size_t i;
  uint mask;
  uint *value_local;
  well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
  *this_local;
  
  rVar1 = max();
  this->state_[0] = *value & rVar1;
  for (s = (uint (*) [16])0x1; s != (uint (*) [16])0x10; s = (uint (*) [16])((long)*s + 1)) {
    this->state_[(long)s] =
         (this[3].state_[(long)((long)s[-1] + 9)] ^ this[3].state_[(long)((long)s[-1] + 9)] >> 0x1e)
         * 0x6c078965 + (int)s & rVar1;
  }
  this->index_ = 0x10;
  return;
}

Assistant:

BOOST_RANDOM_DETAIL_ARITHMETIC_SEED(well_engine, UIntType, value)
    {
        // New seeding algorithm from 
        // http://www.math.sci.hiroshima-u.ac.jp/~m-mat/MT/MT2002/emt19937ar.html
        // In the previous versions, MSBs of the seed affected only MSBs of the
        // state x[].
        const UIntType mask = (max)();

        state_[0] = value & mask;
        
        std::size_t i = 1;
        UIntType (&s)[state_size] = state_;

        for ( ; i != state_size; ++i) {
            // See Knuth "The Art of Computer Programming"
            // Vol. 2, 3rd ed., page 106
            s[i] = static_cast<UIntType>((1812433253U * (s[i - 1] ^ (s[i - 1] >> (w - 2))) + i) & mask);
        }

        index_ = i;
    }